

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void __thiscall
google::protobuf::TextFormat::Printer::PrintFieldName
          (Printer *this,Message *message,Reflection *reflection,FieldDescriptor *field,
          TextGenerator *generator)

{
  second_type *ppFVar1;
  FieldDescriptor *local_48;
  string local_40;
  
  local_48 = field;
  if (this->use_field_number_ == true) {
    SimpleItoa_abi_cxx11_(&local_40,(protobuf *)(ulong)*(uint *)(field + 0x38),(int)reflection);
    TextGenerator::Print(generator,&local_40);
  }
  else {
    local_40._M_dataplus._M_p = (pointer)(this->default_field_value_printer_).ptr_;
    ppFVar1 = FindWithDefault<std::map<google::protobuf::FieldDescriptor_const*,google::protobuf::TextFormat::FieldValuePrinter_const*,std::less<google::protobuf::FieldDescriptor_const*>,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,google::protobuf::TextFormat::FieldValuePrinter_const*>>>>
                        (&this->custom_printers_,&local_48,(second_type *)&local_40);
    (*(*ppFVar1)->_vptr_FieldValuePrinter[0xc])(&local_40,*ppFVar1,message,reflection,local_48);
    TextGenerator::Print(generator,&local_40);
  }
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void TextFormat::Printer::PrintFieldName(const Message& message,
                                         const Reflection* reflection,
                                         const FieldDescriptor* field,
                                         TextGenerator& generator) const {
  // if use_field_number_ is true, prints field number instead
  // of field name.
  if (use_field_number_) {
    generator.Print(SimpleItoa(field->number()));
    return;
  }

  const FieldValuePrinter* printer = FindWithDefault(
      custom_printers_, field, default_field_value_printer_.get());
  generator.Print(printer->PrintFieldName(message, reflection, field));
}